

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void __thiscall duckdb::RLEScanState<int>::~RLEScanState(RLEScanState<int> *this)

{
  (this->super_SegmentScanState)._vptr_SegmentScanState = (_func_int **)&PTR__RLEScanState_0279c938;
  ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
            (&(this->matching_runs).super_unique_ptr<bool[],_std::default_delete<bool[]>_>);
  BufferHandle::~BufferHandle(&this->handle);
  return;
}

Assistant:

explicit RLEScanState(ColumnSegment &segment) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
		handle = buffer_manager.Pin(segment.block);
		entry_pos = 0;
		position_in_entry = 0;
		rle_count_offset = UnsafeNumericCast<uint32_t>(Load<uint64_t>(handle.Ptr() + segment.GetBlockOffset()));
		D_ASSERT(rle_count_offset <= segment.GetBlockManager().GetBlockSize());
	}